

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

bool __thiscall
JsUtil::
BaseDictionary<unsigned_int,_Func::InstrByteCodeRegisterUses,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::TryGetValueAndRemove
          (BaseDictionary<unsigned_int,_Func::InstrByteCodeRegisterUses,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *this,uint *key,InstrByteCodeRegisterUses *value)

{
  int iVar1;
  Type piVar2;
  Type pSVar3;
  Type pSVar4;
  BVSparse<Memory::JitArenaAllocator> *pBVar5;
  KeyValueEntry<unsigned_int,_Func::InstrByteCodeRegisterUses> *pKVar6;
  undefined6 uVar7;
  bool bVar8;
  uint depth;
  uint uVar9;
  uint unaff_R15D;
  uint local_34;
  
  piVar2 = this->buckets;
  depth = 0;
  if (piVar2 == (Type)0x0) {
    uVar9 = 0;
  }
  else {
    local_34 = GetBucket(*key * 2 + 1,this->bucketCount,this->modFunctionIndex);
    unaff_R15D = piVar2[local_34];
    if (-1 < (long)(int)unaff_R15D) {
      pSVar3 = this->entries;
      if (pSVar3[(int)unaff_R15D].
          super_DefaultHashedEntry<unsigned_int,_Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntry>
          .super_KeyValueEntry<unsigned_int,_Func::InstrByteCodeRegisterUses>.
          super_ValueEntry<Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>_>
          .super_KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>.key == *key
         ) {
        depth = 0;
        uVar9 = 0xffffffff;
      }
      else {
        depth = 0;
        do {
          uVar9 = unaff_R15D;
          depth = depth + 1;
          unaff_R15D = pSVar3[uVar9].
                       super_DefaultHashedEntry<unsigned_int,_Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                       .super_KeyValueEntry<unsigned_int,_Func::InstrByteCodeRegisterUses>.
                       super_ValueEntry<Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>_>
                       .
                       super_KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>
                       .next;
          if ((long)(int)unaff_R15D < 0) goto LAB_003f58db;
        } while (pSVar3[(int)unaff_R15D].
                 super_DefaultHashedEntry<unsigned_int,_Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                 .super_KeyValueEntry<unsigned_int,_Func::InstrByteCodeRegisterUses>.
                 super_ValueEntry<Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>_>
                 .super_KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>.key
                 != *key);
      }
      bVar8 = true;
      if (this->stats != (DictionaryStats *)0x0) {
        DictionaryStats::Lookup(this->stats,depth);
      }
      goto LAB_003f58ef;
    }
    uVar9 = 0xffffffff;
  }
LAB_003f58db:
  if (this->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this->stats,depth);
  }
  bVar8 = false;
LAB_003f58ef:
  if (bVar8 != false) {
    pKVar6 = &this->entries[(int)unaff_R15D].
              super_DefaultHashedEntry<unsigned_int,_Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntry>
              .super_KeyValueEntry<unsigned_int,_Func::InstrByteCodeRegisterUses>;
    uVar7 = *(undefined6 *)
             &(pKVar6->
              super_ValueEntry<Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>_>
              ).super_KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>.value.
              field_0x2;
    pBVar5 = this->entries[(int)unaff_R15D].
             super_DefaultHashedEntry<unsigned_int,_Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntry>
             .super_KeyValueEntry<unsigned_int,_Func::InstrByteCodeRegisterUses>.
             super_ValueEntry<Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>_>
             .super_KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>.value.bv
    ;
    value->capturingOpCode =
         (pKVar6->
         super_ValueEntry<Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>_>
         ).super_KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>.value.
         capturingOpCode;
    *(undefined6 *)&value->field_0x2 = uVar7;
    value->bv = pBVar5;
    iVar1 = this->entries[(int)unaff_R15D].
            super_DefaultHashedEntry<unsigned_int,_Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<unsigned_int,_Func::InstrByteCodeRegisterUses>.
            super_ValueEntry<Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>_>
            .super_KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>.next;
    if ((int)uVar9 < 0) {
      this->buckets[local_34] = iVar1;
    }
    else {
      this->entries[uVar9].
      super_DefaultHashedEntry<unsigned_int,_Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntry>
      .super_KeyValueEntry<unsigned_int,_Func::InstrByteCodeRegisterUses>.
      super_ValueEntry<Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>_>
      .super_KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>.next = iVar1;
    }
    pSVar4 = this->entries;
    pSVar3 = pSVar4 + (int)unaff_R15D;
    *(undefined8 *)
     &(pSVar3->
      super_DefaultHashedEntry<unsigned_int,_Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntry>
      ).super_KeyValueEntry<unsigned_int,_Func::InstrByteCodeRegisterUses>.
      super_ValueEntry<Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>_>
      .super_KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>.value = 0;
    (pSVar3->
    super_DefaultHashedEntry<unsigned_int,_Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntry>
    ).super_KeyValueEntry<unsigned_int,_Func::InstrByteCodeRegisterUses>.
    super_ValueEntry<Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>_>
    .super_KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>.value.bv =
         (BVSparse<Memory::JitArenaAllocator> *)0x0;
    pSVar4[(int)unaff_R15D].
    super_DefaultHashedEntry<unsigned_int,_Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntry>
    .super_KeyValueEntry<unsigned_int,_Func::InstrByteCodeRegisterUses>.
    super_ValueEntry<Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>_>
    .super_KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>.key = 0;
    SetNextFreeEntryIndex
              (this,this->entries + (int)unaff_R15D,-(uint)(this->freeCount == 0) | this->freeList);
    this->freeList = unaff_R15D;
    this->freeCount = this->freeCount + 1;
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Remove(this->stats,this->buckets[local_34] == -1);
    }
  }
  return bVar8;
}

Assistant:

bool TryGetValueAndRemove(const TKey& key, TValue* value)
        {
            int i, last;
            uint targetBucket;
            if (FindEntryWithKey(key, &i, &last, &targetBucket))
            {
                *value = entries[i].Value();
                RemoveAt(i, last, targetBucket);
                return true;
            }
            return false;
        }